

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

int pce_load_map(char *fname,int mode)

{
  int local_54;
  int local_50;
  int local_4c;
  int j;
  int i;
  int cnt;
  int nb;
  int size;
  int fsize;
  uchar header [16];
  FILE *fp;
  int mode_local;
  char *fname_local;
  
  j = 0;
  header._8_8_ = open_file(fname,"rb");
  if ((FILE *)header._8_8_ == (FILE *)0x0) {
    fatal_error("Can not open file!");
    fname_local._4_4_ = 1;
  }
  else {
    fread(&size,1,0xc,(FILE *)header._8_8_);
    nb = (uint)(byte)fsize * 0x1000000 + (uint)fsize._1_1_ * 0x10000 + (uint)fsize._2_1_ * 0x100 +
         (uint)fsize._3_1_ + -4;
    if ((size == 0x4d524f46) && (header._0_4_ == 0x50414d46)) {
      labldef(loccnt,1);
      if (pass == 1) {
        loadlc(loccnt,0);
      }
      while (0 < nb) {
        fread(&size,1,8,(FILE *)header._8_8_);
        cnt = (uint)(byte)fsize * 0x1000000 + (uint)fsize._1_1_ * 0x10000 +
              (uint)fsize._2_1_ * 0x100 + (uint)fsize._3_1_;
        nb = (nb + -8) - cnt;
        if (nb < 0) break;
        if (size == 0x59444f42) {
          j = cnt >> 1;
          if (pass == 1) {
            while (cnt != 0) {
              if (cnt < 0x201) {
                local_54 = cnt;
              }
              else {
                local_54 = 0x200;
              }
              fread(buffer,1,(long)local_54,(FILE *)header._8_8_);
              cnt = cnt - local_54;
              local_50 = 0;
              for (local_4c = 0; local_4c < local_54 >> 1; local_4c = local_4c + 1) {
                buffer[local_4c] =
                     (char)((int)((uint)buffer[local_50] + (uint)buffer[local_50 + 1] * 0x100) >> 5)
                     + 0xff;
                local_50 = local_50 + 2;
              }
              putbuffer(buffer,local_54 >> 1);
            }
          }
          else {
            putbuffer((void *)0x0,j);
          }
          break;
        }
        fseek((FILE *)header._8_8_,(long)cnt,1);
      }
      fclose((FILE *)header._8_8_);
      if (lablptr == (t_symbol *)0x0) {
        if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type == 7)) {
          lastlabl->data_size = j + lastlabl->data_size;
        }
      }
      else {
        lablptr->data_type = 7;
        lablptr->data_size = j;
      }
      if (pass == 1) {
        println();
      }
      fname_local._4_4_ = 1;
    }
    else {
      if (mode != 0) {
        fatal_error("Invalid FMP format!");
      }
      fclose((FILE *)header._8_8_);
      fname_local._4_4_ = mode;
    }
  }
  return fname_local._4_4_;
}

Assistant:

int
pce_load_map(char *fname, int mode)
{
	FILE *fp;
	unsigned char header[16];
	int fsize;
	int size;
	int nb;
	int cnt;
	int i, j;

	/* init */
	cnt = 0;

	/* open the file */
	if ((fp = open_file(fname, "rb")) == NULL) {
		fatal_error("Can not open file!");
		return (1);
	}

	/* check FMP header */
	fread(header, 1, 12, fp);
	fsize = (header[4] << 24) +
			(header[5] << 16) +
			(header[6] <<  8) +
			 header[7] - 4;

	if (memcmp(header, "FORM", 4) || memcmp(&header[8], "FMAP", 4)) {
		/* incorrect header */
		if (mode)
			fatal_error("Invalid FMP format!");
		fclose(fp);
		return(mode);
	}

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* browse chunks */
	while (fsize > 0) {
		fread(header, 1, 8, fp);
		size = (header[4] << 24) +
			   (header[5] << 16) +
			   (header[6] <<  8) +
			    header[7];
		fsize -= 8;
		fsize -= size;
		if (fsize < 0)
			break;

		/* BODY chunk */
		if (memcmp(header, "BODY", 4) == 0) {
			/* add size */
			cnt += (size >> 1);

			if (pass == LAST_PASS) {
				/* read chunk */
				while (size) {
					/* read a block */
					nb = (size > 512) ? 512 : size;
					fread(buffer, 1, nb, fp);
					size -= nb;
					nb >>= 1;

					/* convert word -> byte */
					for (i = 0, j = 0; i < nb; i++, j += 2)
						buffer[i] = ((buffer[j] + (buffer[j+1] << 8)) >> 5) - 1;

					/* output buffer */
					putbuffer(buffer, nb);
				}
			}
			else
				putbuffer(NULL, size >> 1);

			/* ok */
			break;
		}
		else {
			/* unsupported chunk */
			fseek(fp, size, SEEK_CUR);
		}
	}

	/* close file */
	fclose(fp);

	/* size */
	if (lablptr) {
		lablptr->data_type = P_INCBIN;
		lablptr->data_size = cnt;
	}
	else {
		if (lastlabl) {
			if (lastlabl->data_type == P_INCBIN)
				lastlabl->data_size += cnt;
		}
	}

	/* output line */
	if (pass == LAST_PASS)
		println();

	/* ok */
	return (1);
}